

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

void tcu::estimatePixelValueRange(ConstPixelBufferAccess *access,Vec4 *minVal,Vec4 *maxVal)

{
  float fVar1;
  float fVar2;
  float fVar3;
  TextureChannelClass TVar4;
  int z;
  int iVar5;
  int x;
  int y_00;
  int y;
  int z_00;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  Vec4 p;
  Vector<float,_4> local_48;
  
  TVar4 = getTextureChannelClass((access->m_format).type);
  if (TVar4 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
    fVar10 = -1.0;
  }
  else {
    if (TVar4 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      Vector<float,_4>::Vector(&local_48,3.4028235e+38);
      *(ulong *)minVal->m_data = CONCAT44(local_48.m_data[1],local_48.m_data[0]);
      *(ulong *)(minVal->m_data + 2) = CONCAT44(local_48.m_data[3],local_48.m_data[2]);
      Vector<float,_4>::Vector(&local_48,1.1754944e-38);
      *(ulong *)maxVal->m_data = CONCAT44(local_48.m_data[1],local_48.m_data[0]);
      *(ulong *)(maxVal->m_data + 2) = CONCAT44(local_48.m_data[3],local_48.m_data[2]);
      for (iVar5 = 0; iVar5 < (access->m_size).m_data[2]; iVar5 = iVar5 + 2) {
        for (z_00 = 0; z_00 < (access->m_size).m_data[1]; z_00 = z_00 + 2) {
          for (y_00 = 0; y_00 < (access->m_size).m_data[0]; y_00 = y_00 + 2) {
            ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)&local_48,(int)access,y_00,z_00);
            uVar6 = -(uint)!NAN(local_48.m_data[0]);
            uVar7 = -(uint)!NAN(local_48.m_data[1]);
            uVar8 = -(uint)!NAN(local_48.m_data[2]);
            uVar9 = -(uint)!NAN(local_48.m_data[3]);
            fVar10 = minVal->m_data[0];
            fVar1 = minVal->m_data[1];
            fVar2 = minVal->m_data[2];
            fVar3 = minVal->m_data[3];
            minVal->m_data[0] =
                 (float)((~-(uint)(fVar10 <= local_48.m_data[0]) & (uint)local_48.m_data[0] |
                         (uint)fVar10 & -(uint)(fVar10 <= local_48.m_data[0])) & uVar6 |
                        ~uVar6 & (uint)fVar10);
            minVal->m_data[1] =
                 (float)((~-(uint)(fVar1 <= local_48.m_data[1]) & (uint)local_48.m_data[1] |
                         (uint)fVar1 & -(uint)(fVar1 <= local_48.m_data[1])) & uVar7 |
                        ~uVar7 & (uint)fVar1);
            minVal->m_data[2] =
                 (float)((~-(uint)(fVar2 <= local_48.m_data[2]) & (uint)local_48.m_data[2] |
                         (uint)fVar2 & -(uint)(fVar2 <= local_48.m_data[2])) & uVar8 |
                        ~uVar8 & (uint)fVar2);
            minVal->m_data[3] =
                 (float)((~-(uint)(fVar3 <= local_48.m_data[3]) & (uint)local_48.m_data[3] |
                         (uint)fVar3 & -(uint)(fVar3 <= local_48.m_data[3])) & uVar9 |
                        ~uVar9 & (uint)fVar3);
            fVar10 = maxVal->m_data[0];
            fVar1 = maxVal->m_data[1];
            fVar2 = maxVal->m_data[2];
            fVar3 = maxVal->m_data[3];
            maxVal->m_data[0] =
                 (float)(~uVar6 & (uint)fVar10 |
                        (~-(uint)(local_48.m_data[0] <= fVar10) & (uint)local_48.m_data[0] |
                        (uint)fVar10 & -(uint)(local_48.m_data[0] <= fVar10)) & uVar6);
            maxVal->m_data[1] =
                 (float)(~uVar7 & (uint)fVar1 |
                        (~-(uint)(local_48.m_data[1] <= fVar1) & (uint)local_48.m_data[1] |
                        (uint)fVar1 & -(uint)(local_48.m_data[1] <= fVar1)) & uVar7);
            maxVal->m_data[2] =
                 (float)(~uVar8 & (uint)fVar2 |
                        (~-(uint)(local_48.m_data[2] <= fVar2) & (uint)local_48.m_data[2] |
                        (uint)fVar2 & -(uint)(local_48.m_data[2] <= fVar2)) & uVar8);
            maxVal->m_data[3] =
                 (float)(~uVar9 & (uint)fVar3 |
                        (~-(uint)(local_48.m_data[3] <= fVar3) & (uint)local_48.m_data[3] |
                        (uint)fVar3 & -(uint)(local_48.m_data[3] <= fVar3)) & uVar9);
          }
        }
      }
      return;
    }
    fVar10 = 0.0;
  }
  Vector<float,_4>::Vector(&local_48,fVar10);
  *(ulong *)minVal->m_data = CONCAT44(local_48.m_data[1],local_48.m_data[0]);
  *(ulong *)(minVal->m_data + 2) = CONCAT44(local_48.m_data[3],local_48.m_data[2]);
  Vector<float,_4>::Vector(&local_48,1.0);
  *(ulong *)maxVal->m_data = CONCAT44(local_48.m_data[1],local_48.m_data[0]);
  *(ulong *)(maxVal->m_data + 2) = CONCAT44(local_48.m_data[3],local_48.m_data[2]);
  return;
}

Assistant:

void estimatePixelValueRange (const ConstPixelBufferAccess& access, Vec4& minVal, Vec4& maxVal)
{
	const TextureFormat& format = access.getFormat();

	switch (getTextureChannelClass(format.type))
	{
		case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			// Normalized unsigned formats.
			minVal = Vec4(0.0f);
			maxVal = Vec4(1.0f);
			break;

		case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
			// Normalized signed formats.
			minVal = Vec4(-1.0f);
			maxVal = Vec4(+1.0f);
			break;

		default:
			// \note Samples every 4/8th pixel.
			minVal = Vec4(std::numeric_limits<float>::max());
			maxVal = Vec4(std::numeric_limits<float>::min());

			for (int z = 0; z < access.getDepth(); z += 2)
			{
				for (int y = 0; y < access.getHeight(); y += 2)
				{
					for (int x = 0; x < access.getWidth(); x += 2)
					{
						Vec4 p = access.getPixel(x, y, z);

						minVal[0] = (deFloatIsNaN(p[0]) ? minVal[0] : de::min(minVal[0], p[0]));
						minVal[1] = (deFloatIsNaN(p[1]) ? minVal[1] : de::min(minVal[1], p[1]));
						minVal[2] = (deFloatIsNaN(p[2]) ? minVal[2] : de::min(minVal[2], p[2]));
						minVal[3] = (deFloatIsNaN(p[3]) ? minVal[3] : de::min(minVal[3], p[3]));

						maxVal[0] = (deFloatIsNaN(p[0]) ? maxVal[0] : de::max(maxVal[0], p[0]));
						maxVal[1] = (deFloatIsNaN(p[1]) ? maxVal[1] : de::max(maxVal[1], p[1]));
						maxVal[2] = (deFloatIsNaN(p[2]) ? maxVal[2] : de::max(maxVal[2], p[2]));
						maxVal[3] = (deFloatIsNaN(p[3]) ? maxVal[3] : de::max(maxVal[3], p[3]));
					}
				}
			}
			break;
	}
}